

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

void gray_record_cell(gray_PWorker worker)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  PCell_conflict pTVar8;
  long lVar9;
  PCell_conflict pTVar10;
  PCell *ppTVar11;
  
  iVar7 = worker->ex;
  ppTVar11 = worker->ycells + ((long)worker->ey - (long)worker->min_ey);
  while ((pTVar8 = *ppTVar11, pTVar8 != (PCell_conflict)0x0 && (pTVar8->x <= iVar7))) {
    if (pTVar8->x == iVar7) {
      uVar2 = worker->area;
      uVar5 = worker->cover;
      uVar3 = pTVar8->cover;
      uVar6 = pTVar8->area;
      pTVar8->cover = uVar3 + uVar5;
      pTVar8->area = uVar6 + uVar2;
      return;
    }
    ppTVar11 = &pTVar8->next;
  }
  lVar9 = worker->num_cells;
  if (lVar9 < worker->max_cells) {
    pTVar10 = worker->cells;
    worker->num_cells = lVar9 + 1;
    pTVar10[lVar9].x = iVar7;
    uVar1 = worker->area;
    uVar4 = worker->cover;
    pTVar10[lVar9].cover = uVar4;
    pTVar10[lVar9].area = uVar1;
    pTVar10[lVar9].next = pTVar8;
    *ppTVar11 = pTVar10 + lVar9;
    return;
  }
  longjmp((__jmp_buf_tag *)worker,1);
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    PCell  *pcell, cell;
    TCoord  x = ras.ex;


    pcell = &ras.ycells[ras.ey - ras.min_ey];
    for (;;)
    {
      cell = *pcell;
      if ( !cell || cell->x > x )
        break;

      if ( cell->x == x )
        goto Found;

      pcell = &cell->next;
    }

    if ( ras.num_cells >= ras.max_cells )
      ft_longjmp( ras.jump_buffer, 1 );

    /* insert new cell */
    cell        = ras.cells + ras.num_cells++;
    cell->x     = x;
    cell->area  = ras.area;
    cell->cover = ras.cover;

    cell->next  = *pcell;
    *pcell      = cell;

    return;

  Found:
    /* update old cell */
    cell->area  += ras.area;
    cell->cover += ras.cover;
  }